

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O3

bool __thiscall libcellml::Importer::resolveImports(Importer *this,ModelPtr *model,string *basePath)

{
  pointer *ppuVar1;
  IssueImpl *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pointer psVar3;
  pointer psVar4;
  pointer psVar5;
  pointer psVar6;
  bool bVar7;
  LoggerImpl *pLVar8;
  ImporterImpl *pIVar9;
  bool bVar10;
  pointer psVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  IssuePtr issue;
  History history;
  string normalisedBasePath;
  Logger local_a0;
  vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
  local_90;
  History local_78;
  string local_58;
  ModelPtr *local_38;
  
  local_78.
  super__Vector_base<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pLVar8 = Logger::pFunc(&this->super_Logger);
  Logger::LoggerImpl::removeAllIssues(pLVar8);
  if ((model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0) {
    Issue::IssueImpl::create();
    this_00 = (IssueImpl *)
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
              ((long)local_90.
                     super__Vector_base<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 8))->_M_pi;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"Cannot resolve imports for null model.","");
    Issue::IssueImpl::setDescription(this_00,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    Issue::IssueImpl::setReferenceRule
              ((IssueImpl *)
               ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)local_90.
                      super__Vector_base<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 8))->_M_pi,IMPORTER_NULL_MODEL);
    pLVar8 = Logger::pFunc(&this->super_Logger);
    Logger::LoggerImpl::addIssue(pLVar8,(IssuePtr *)&local_90);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_90.
        super__Vector_base<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_90.
                 super__Vector_base<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    }
    bVar10 = false;
  }
  else {
    clearImports((Importer *)pLVar8,model);
    normalisePath(&local_58,basePath);
    local_a0._vptr_Logger =
         (_func_int **)
         (model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_a0.mPimpl =
         (LoggerImpl *)
         (model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
    ;
    if (local_a0.mPimpl != (LoggerImpl *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ppuVar1 = &((local_a0.mPimpl)->mErrors).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *(int *)ppuVar1 = *(int *)ppuVar1 + 1;
        UNLOCK();
      }
      else {
        ppuVar1 = &((local_a0.mPimpl)->mErrors).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *(int *)ppuVar1 = *(int *)ppuVar1 + 1;
      }
    }
    getImportedUnits((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                      *)&local_90,(ModelConstPtr *)&local_a0);
    local_38 = model;
    if (local_a0.mPimpl != (LoggerImpl *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0.mPimpl);
    }
    psVar6 = local_90.
             super__Vector_base<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar10 = true;
    psVar3 = local_78.
             super__Vector_base<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar4 = local_78.
             super__Vector_base<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_90.
                   super__Vector_base<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; psVar11 = psVar3,
        local_78.
        super__Vector_base<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
        ._M_impl.super__Vector_impl_data._M_start = psVar3,
        local_78.
        super__Vector_base<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = psVar4, psVar5 = psVar4,
        p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)psVar6; p_Var12 = p_Var12 + 1) {
      for (; psVar4 != psVar11; psVar11 = (pointer)((long)psVar11 + 0x10)) {
        p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((__shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2> *)
                 ((long)psVar11 + 8))->_M_ptr;
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        }
        psVar5 = psVar3;
      }
      local_78.
      super__Vector_base<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = psVar5;
      pIVar9 = (ImporterImpl *)Logger::pFunc(&this->super_Logger);
      bVar7 = ImporterImpl::fetchUnits(pIVar9,(UnitsPtr *)p_Var12,&local_58,&local_78);
      if (!bVar7) {
        Logger::issueCount(&this->super_Logger);
        Logger::issue(&local_a0,(size_t)this);
        AnyCellmlElement::AnyCellmlElementImpl::setUnits
                  (*(AnyCellmlElementImpl **)
                    (((ComponentEntity *)local_a0._vptr_Logger)->super_NamedEntity).
                    super_ParentedEntity.super_Entity.mPimpl[1].mId._M_string_length,
                   (UnitsPtr *)p_Var12);
        if (local_a0.mPimpl != (LoggerImpl *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0.mPimpl);
        }
        bVar10 = false;
      }
      psVar3 = local_78.
               super__Vector_base<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar4 = local_78.
               super__Vector_base<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    std::
    vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>::
    ~vector((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
             *)&local_90);
    local_a0._vptr_Logger =
         (_func_int **)
         (local_38->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_a0.mPimpl =
         (LoggerImpl *)
         (local_38->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
         _M_pi;
    if (local_a0.mPimpl != (LoggerImpl *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ppuVar1 = &((local_a0.mPimpl)->mErrors).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *(int *)ppuVar1 = *(int *)ppuVar1 + 1;
        UNLOCK();
      }
      else {
        ppuVar1 = &((local_a0.mPimpl)->mErrors).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *(int *)ppuVar1 = *(int *)ppuVar1 + 1;
      }
    }
    getImportedComponents(&local_90,(ComponentEntityConstPtr *)&local_a0);
    p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_90.
              super__Vector_base<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (local_a0.mPimpl != (LoggerImpl *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0.mPimpl);
      p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_90.
                super__Vector_base<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    for (; psVar4 = local_78.
                    super__Vector_base<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
        psVar3 = local_78.
                 super__Vector_base<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        p_Var12 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_90.
        super__Vector_base<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; p_Var12 = p_Var12 + 1) {
      psVar11 = local_78.
                super__Vector_base<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (local_78.
          super__Vector_base<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_78.
          super__Vector_base<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        do {
          p_Var2 = (psVar11->super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>
                   )._M_refcount._M_pi;
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
          }
          psVar11 = psVar11 + 1;
        } while (psVar11 != psVar4);
        local_78.
        super__Vector_base<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = psVar3;
      }
      pIVar9 = (ImporterImpl *)Logger::pFunc(&this->super_Logger);
      bVar7 = ImporterImpl::fetchComponent(pIVar9,(ComponentPtr *)p_Var12,&local_58,&local_78);
      if (!bVar7) {
        Logger::issueCount(&this->super_Logger);
        Logger::issue(&local_a0,(size_t)this);
        AnyCellmlElement::AnyCellmlElementImpl::setComponent
                  (*(AnyCellmlElementImpl **)
                    (((ComponentEntity *)local_a0._vptr_Logger)->super_NamedEntity).
                    super_ParentedEntity.super_Entity.mPimpl[1].mId._M_string_length,
                   (ComponentPtr *)p_Var12,COMPONENT);
        if (local_a0.mPimpl != (LoggerImpl *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0.mPimpl);
        }
        bVar10 = false;
      }
    }
    std::
    vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
    ::~vector(&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
  ::~vector(&local_78);
  return bVar10;
}

Assistant:

bool Importer::resolveImports(ModelPtr &model, const std::string &basePath)
{
    bool status = true;
    History history;

    pFunc()->removeAllIssues();

    if (model == nullptr) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription("Cannot resolve imports for null model.");
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORTER_NULL_MODEL);
        pFunc()->addIssue(issue);
        return false;
    }

    clearImports(model);
    auto normalisedBasePath = normalisePath(basePath);

    for (const UnitsPtr &units : getImportedUnits(model)) {
        history.clear();
        if (!pFunc()->fetchUnits(units, normalisedBasePath, history)) {
            // Get the last issue recorded and change its object to be the top-level importing item.
            issue(issueCount() - 1)->mPimpl->mItem->mPimpl->setUnits(units);
            status = false;
        }
    }

    for (const ComponentPtr &component : getImportedComponents(model)) {
        history.clear();
        if (!pFunc()->fetchComponent(component, normalisedBasePath, history)) {
            issue(issueCount() - 1)->mPimpl->mItem->mPimpl->setComponent(component);
            status = false;
        }
    }

    return status;
}